

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O0

void __thiscall
duckdb::LogicalExport::LogicalExport
          (LogicalExport *this,ClientContext *context,
          unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *copy_info_p,
          unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
          *exported_tables_p)

{
  undefined8 *in_RDI;
  CopyInfo *in_stack_00000018;
  ClientContext *in_stack_00000020;
  LogicalExport *in_stack_00000028;
  undefined7 in_stack_ffffffffffffff68;
  LogicalOperatorType in_stack_ffffffffffffff6f;
  LogicalOperator *in_stack_ffffffffffffff70;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>
  *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *src;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> local_40 [8];
  
  LogicalOperator::LogicalOperator(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f);
  *in_RDI = &PTR__LogicalExport_03511608;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             in_stack_ffffffffffffff70,
             (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  unique_ptr_cast<duckdb::ParseInfo,duckdb::CopyInfo>(in_stack_ffffffffffffff78);
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)0xe5beb0
            );
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
            ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
             in_stack_ffffffffffffff70);
  GetCopyFunction(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  src = local_40;
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             (in_RDI + 100),
             (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
             CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  unique_ptr_cast<duckdb::ParseInfo,duckdb::BoundExportData>(src);
  unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)0xe5bf38
            );
  return;
}

Assistant:

LogicalExport::LogicalExport(ClientContext &context, unique_ptr<ParseInfo> copy_info_p,
                             unique_ptr<ParseInfo> exported_tables_p)
    : LogicalOperator(LogicalOperatorType::LOGICAL_EXPORT),
      copy_info(unique_ptr_cast<ParseInfo, CopyInfo>(std::move(copy_info_p))),
      function(GetCopyFunction(context, *copy_info)),
      exported_tables(unique_ptr_cast<ParseInfo, BoundExportData>(std::move(exported_tables_p))) {
}